

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VectorT_inc.hh
# Opt level: O0

vector_type * __thiscall
OpenMesh::VectorT<double,_3>::operator+
          (vector_type *__return_storage_ptr__,VectorT<double,_3> *this,vector_type *_v)

{
  vector_type *_v_local;
  VectorT<double,_3> *this_local;
  
  VectorT(__return_storage_ptr__,
          (this->super_VectorDataT<double,_3>).values_[0] +
          (_v->super_VectorDataT<double,_3>).values_[0],
          (this->super_VectorDataT<double,_3>).values_[1] +
          (_v->super_VectorDataT<double,_3>).values_[1],
          (this->super_VectorDataT<double,_3>).values_[2] +
          (_v->super_VectorDataT<double,_3>).values_[2]);
  return __return_storage_ptr__;
}

Assistant:

inline vector_type operator+(const vector_type& _v) const {
#if DIM==N
    return vector_type(*this) += _v;
#else
#define expr(i) Base::values_[i] + _v.Base::values_[i]
    return vector_type(unroll_csv(expr));
#undef expr
#endif
  }